

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

void jpeg_set_marker_processor
               (j_decompress_ptr cinfo,int marker_code,jpeg_marker_parser_method routine)

{
  my_marker_ptr marker;
  jpeg_marker_parser_method routine_local;
  int marker_code_local;
  j_decompress_ptr cinfo_local;
  
  if (marker_code == 0xfe) {
    cinfo->marker[1].reset_marker_reader = (_func_void_j_decompress_ptr *)routine;
  }
  else if ((marker_code < 0xe0) || (0xef < marker_code)) {
    cinfo->err->msg_code = 0x46;
    (cinfo->err->msg_parm).i[0] = marker_code;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  else {
    (&cinfo->marker[1].read_markers)[marker_code + -0xe0] = (_func_int_j_decompress_ptr *)routine;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_set_marker_processor (j_decompress_ptr cinfo, int marker_code,
			   jpeg_marker_parser_method routine)
{
  my_marker_ptr marker = (my_marker_ptr) cinfo->marker;

  if (marker_code == (int) M_COM)
    marker->process_COM = routine;
  else if (marker_code >= (int) M_APP0 && marker_code <= (int) M_APP15)
    marker->process_APPn[marker_code - (int) M_APP0] = routine;
  else
    ERREXIT1(cinfo, JERR_UNKNOWN_MARKER, marker_code);
}